

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

Fl_Plugin * __thiscall Fl_Plugin_Manager::plugin(Fl_Plugin_Manager *this,char *name)

{
  char cVar1;
  undefined1 local_68 [8];
  Fl_Preferences pin;
  Fl_Plugin *ret;
  char buf [34];
  char *name_local;
  Fl_Plugin_Manager *this_local;
  
  pin.rootNode = (RootNode *)0x0;
  unique0x100000ab = name;
  cVar1 = Fl_Preferences::groupExists(&this->super_Fl_Preferences,name);
  if (cVar1 == '\0') {
    this_local = (Fl_Plugin_Manager *)0x0;
  }
  else {
    Fl_Preferences::Fl_Preferences
              ((Fl_Preferences *)local_68,&this->super_Fl_Preferences,stack0xffffffffffffffe0);
    Fl_Preferences::get((Fl_Preferences *)local_68,"address",(char *)&ret,"",0x22);
    if ((char)ret == '@') {
      pin.rootNode = (RootNode *)a2p((char *)((long)&ret + 1));
    }
    this_local = (Fl_Plugin_Manager *)pin.rootNode;
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_68);
  }
  return (Fl_Plugin *)this_local;
}

Assistant:

Fl_Plugin *Fl_Plugin_Manager::plugin(const char *name) {
  char buf[34];
  Fl_Plugin *ret = 0;
  if (groupExists(name)) {
    Fl_Preferences pin(this, name);
    pin.get("address", buf, "", 34);
    if (buf[0]=='@') ret = (Fl_Plugin*)a2p(buf+1);
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: returning plugin named \"%s\": (%s) %p\n", name, buf, ret);
#endif
    return ret;
  } else {
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: no plugin found named \"%s\"\n", name);
#endif
    return 0L;
  }
}